

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O0

void __thiscall agge::tests::RectangleTests::RectangleProducesIterator(RectangleTests *this)

{
  allocator local_2a1;
  string local_2a0 [32];
  LocationInfo local_280;
  int local_254 [2];
  allocator local_249;
  string local_248 [32];
  LocationInfo local_228;
  int local_1fc [2];
  allocator local_1f1;
  string local_1f0 [32];
  LocationInfo local_1d0;
  int local_1a4 [2];
  allocator local_199;
  string local_198 [32];
  LocationInfo local_178;
  int local_14c [2];
  allocator local_141;
  string local_140 [32];
  LocationInfo local_120;
  int local_f4 [2];
  allocator local_e9;
  string local_e8 [32];
  LocationInfo local_c8;
  int local_9c [6];
  allocator local_81;
  string local_80 [32];
  LocationInfo local_60;
  int local_34 [2];
  undefined1 local_2c [8];
  rectangle r;
  real_t y;
  real_t x;
  RectangleTests *this_local;
  
  rectangle::rectangle((rectangle *)local_2c,10.0,20.0,30.0,40.0);
  local_34[1] = 1;
  local_34[0] = rectangle::vertex((rectangle *)local_2c,(real_t *)&r._step,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_81);
  ut::LocationInfo::LocationInfo(&local_60,(string *)local_80,0x5e);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_34 + 1),local_34,&local_60);
  ut::LocationInfo::~LocationInfo(&local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_9c[1] = 2;
  local_9c[0] = rectangle::vertex((rectangle *)local_2c,(real_t *)&r._step,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_e9);
  ut::LocationInfo::LocationInfo(&local_c8,(string *)local_e8,0x5f);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_9c + 1),local_9c,&local_c8);
  ut::LocationInfo::~LocationInfo(&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_f4[1] = 2;
  local_f4[0] = rectangle::vertex((rectangle *)local_2c,(real_t *)&r._step,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_141);
  ut::LocationInfo::LocationInfo(&local_120,(string *)local_140,0x60);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_f4 + 1),local_f4,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  local_14c[1] = 2;
  local_14c[0] = rectangle::vertex((rectangle *)local_2c,(real_t *)&r._step,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_199);
  ut::LocationInfo::LocationInfo(&local_178,(string *)local_198,0x61);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_14c + 1),local_14c,&local_178);
  ut::LocationInfo::~LocationInfo(&local_178);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  local_1a4[1] = 0x30;
  local_1a4[0] = rectangle::vertex((rectangle *)local_2c,(real_t *)&r._step,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_1f1);
  ut::LocationInfo::LocationInfo(&local_1d0,(string *)local_1f0,0x62);
  ut::are_equal<int,int>(local_1a4 + 1,local_1a4,&local_1d0);
  ut::LocationInfo::~LocationInfo(&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  local_1fc[1] = 0;
  local_1fc[0] = rectangle::vertex((rectangle *)local_2c,(real_t *)&r._step,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_249);
  ut::LocationInfo::LocationInfo(&local_228,(string *)local_248,99);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_1fc + 1),local_1fc,&local_228);
  ut::LocationInfo::~LocationInfo(&local_228);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  local_254[1] = 0;
  local_254[0] = rectangle::vertex((rectangle *)local_2c,(real_t *)&r._step,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_2a1);
  ut::LocationInfo::LocationInfo(&local_280,(string *)local_2a0,100);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_254 + 1),local_254,&local_280);
  ut::LocationInfo::~LocationInfo(&local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  return;
}

Assistant:

test( RectangleProducesIterator )
			{
				// INIT
				real_t x, y;

				// INIT / ACT
				rectangle r(10.0f, 20.0f, 30.0f, 40.0f);

				// ACT / ASSERT
				assert_equal(path_command_move_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_end_poly | path_flag_close, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
			}